

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall HPresolve::fillStackRowBounds(HPresolve *this,int row)

{
  stack<double,_std::deque<double,_std::allocator<double>_>_> *this_00;
  reference pvVar1;
  
  this_00 = &(this->super_HPreData).postValue;
  pvVar1 = std::vector<double,_std::allocator<double>_>::at
                     (&(this->super_HPreData).rowUpper,(long)row);
  std::deque<double,_std::allocator<double>_>::push_back(&this_00->c,pvVar1);
  pvVar1 = std::vector<double,_std::allocator<double>_>::at
                     (&(this->super_HPreData).rowLower,(long)row);
  std::deque<double,_std::allocator<double>_>::push_back(&this_00->c,pvVar1);
  return;
}

Assistant:

void HPresolve::fillStackRowBounds(int row) {
	postValue.push(rowUpper.at(row));
	postValue.push(rowLower.at(row));
}